

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O3

void Map_TimePropagateRequired(Map_Man_t *p)

{
  Map_Man_t *p_00;
  undefined8 uVar1;
  long lVar2;
  Map_SuperLib_t *pMVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  Map_Man_t *p_01;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  lVar8 = (long)p->vMapObjs->nSize;
  if (0 < lVar8) {
    uVar9 = lVar8 + 1;
    do {
      p_00 = (Map_Man_t *)p->vMapObjs->pArray[uVar9 - 2];
      if (p_00->nOutputs != 0) {
        iVar5 = Map_NodeIsBuf((Map_Node_t *)p_00);
        if (iVar5 == 0) {
          if (((ulong)p_00 & 1) != 0) {
            __assert_fail("!Map_IsComplement(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                          ,0x138,"void Map_TimePropagateRequired(Map_Man_t *)");
          }
          if ((*(Map_Cut_t **)&p_00->DelayTarget == (Map_Cut_t *)0x0) &&
             (lVar8._0_4_ = p_00->fSwitching, lVar8._4_4_ = p_00->fSkipFanout, lVar8 == 0)) {
            __assert_fail("pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                          ,0x13a,"void Map_TimePropagateRequired(Map_Man_t *)");
          }
          if ((*(int *)&p_00->pOutputs < 1) && (*(int *)((long)&p_00->pOutputs + 4) < 1)) {
            __assert_fail("pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                          ,0x13c,"void Map_TimePropagateRequired(Map_Man_t *)");
          }
          bVar10 = *(Map_Cut_t **)&p_00->DelayTarget != (Map_Cut_t *)0x0;
          lVar2._0_4_ = p_00->fSwitching;
          lVar2._4_4_ = p_00->fSkipFanout;
          bVar11 = lVar2 == 0;
          if ((!bVar10 || bVar11) &&
             (uVar6 = (ulong)(bVar10 || bVar11), 0 < *(int *)((long)&p_00->pOutputs + uVar6 * 4))) {
            uVar7 = (ulong)(!bVar10 && !bVar11);
            fVar12 = *(float *)((long)p_00->uTruths + uVar7 * 0xc + -0x38);
            pMVar3 = p->pSuperLib;
            fVar13 = *(float *)((long)p_00->uTruths + uVar6 * 0xc + -0x38) -
                     (pMVar3->tDelayInv).Rise;
            fVar14 = *(float *)((long)p_00->uTruths + uVar7 * 0xc + -0x34);
            if (fVar13 <= fVar14) {
              fVar14 = fVar13;
            }
            *(float *)((long)p_00->uTruths + uVar7 * 0xc + -0x34) = fVar14;
            fVar14 = *(float *)((long)p_00->uTruths + uVar6 * 0xc + -0x34) -
                     (pMVar3->tDelayInv).Fall;
            if (fVar14 <= fVar12) {
              fVar12 = fVar14;
            }
            *(float *)((long)p_00->uTruths + uVar7 * 0xc + -0x38) = fVar12;
          }
          fVar12 = ((Map_Time_t *)&p_00->fRequiredGlo)->Rise;
          fVar14 = p_00->fEpsilon;
          if (fVar12 <= p_00->fEpsilon) {
            fVar14 = fVar12;
          }
          p_00->AreaBase = fVar14;
          fVar12 = (float)p_00->nIterations;
          if (p_00->AreaFinal <= (float)p_00->nIterations) {
            fVar12 = p_00->AreaFinal;
          }
          p_00->fObeyFanoutLimits = (int)fVar12;
          p_01 = p_00;
          iVar5 = Map_NodeIsAnd((Map_Node_t *)p_00);
          if (iVar5 != 0) {
            if ((*(Map_Cut_t **)&p_00->DelayTarget != (Map_Cut_t *)0x0) &&
               (p_00->AreaBase <= 3.4028235e+37 && p_00->AreaBase != 3.4028235e+37)) {
              Map_TimePropagateRequiredPhase(p_01,(Map_Node_t *)p_00,0);
            }
            lVar4._0_4_ = p_00->fSwitching;
            lVar4._4_4_ = p_00->fSkipFanout;
            if ((lVar4 != 0) &&
               ((float)p_00->fObeyFanoutLimits <= 3.4028235e+37 &&
                (float)p_00->fObeyFanoutLimits != 3.4028235e+37)) {
              Map_TimePropagateRequiredPhase(p_01,(Map_Node_t *)p_00,1);
            }
          }
        }
        else {
          if ((Map_Node_t *)p_00->pNodeDelays != (Map_Node_t *)0x0) {
            __assert_fail("pNode->p2 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTime.c"
                          ,0x131,"void Map_TimePropagateRequired(Map_Man_t *)");
          }
          uVar1 = *(undefined8 *)&p_00->fRequiredGlo;
          uVar7 = (ulong)p_00->vMapBufs & 0xfffffffffffffffe;
          uVar6 = (ulong)((uint)(Map_Node_t *)p_00->vMapBufs & 1);
          *(float *)(uVar7 + 0x80 + uVar6 * 0xc) = p_00->AreaBase;
          *(undefined8 *)(uVar7 + 0x78 + uVar6 * 0xc) = uVar1;
          uVar1 = *(undefined8 *)&p_00->AreaFinal;
          uVar6 = (ulong)p_00->vMapBufs & 0xfffffffffffffffe;
          uVar7 = (ulong)(~(uint)(Map_Node_t *)p_00->vMapBufs & 1);
          *(int *)(uVar6 + 0x80 + uVar7 * 0xc) = p_00->fObeyFanoutLimits;
          *(undefined8 *)(uVar6 + 0x78 + uVar7 * 0xc) = uVar1;
        }
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return;
}

Assistant:

void Map_TimePropagateRequired( Map_Man_t * p )
{
    Map_Node_t * pNode;
    //Map_Time_t tReqOutTest, * ptReqOutTest = &tReqOutTest;
    Map_Time_t * ptReqIn, * ptReqOut;
    int fPhase, k;

    // go through the nodes in the reverse topological order
    for ( k = p->vMapObjs->nSize - 1; k >= 0; k-- )
    {
        pNode = p->vMapObjs->pArray[k];
        if ( pNode->nRefAct[2] == 0 )
            continue;

        // propagate required times through the buffer
        if ( Map_NodeIsBuf(pNode) )
        {
            assert( pNode->p2 == NULL );
            Map_Regular(pNode->p1)->tRequired[ Map_IsComplement(pNode->p1)] = pNode->tRequired[0];
            Map_Regular(pNode->p1)->tRequired[!Map_IsComplement(pNode->p1)] = pNode->tRequired[1];
            continue;
        }

        // this computation works for regular nodes only
        assert( !Map_IsComplement(pNode) );
        // at least one phase should be mapped
        assert( pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL );
        // the node should be used in the currently assigned mapping
        assert( pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0 );

        // if one of the cuts is not given, project the required times from the other cut
        if ( pNode->pCutBest[0] == NULL || pNode->pCutBest[1] == NULL )
        {
//            assert( 0 );
            // get the missing phase 
            fPhase = (pNode->pCutBest[1] == NULL); 
            // check if the missing phase is needed in the mapping
            if ( pNode->nRefAct[fPhase] > 0 )
            {
                // get the pointers to the required times of the missing phase
                ptReqOut = pNode->tRequired +  fPhase;
//                assert( ptReqOut->Fall < MAP_FLOAT_LARGE );
                // get the pointers to the required times of the present phase
                ptReqIn  = pNode->tRequired + !fPhase;
                // propagate the required times from the missing phase to the present phase
    //            tArrInv.Fall  = pMatch->tArrive.Rise + p->pSuperLib->tDelayInv.Fall;
    //            tArrInv.Rise  = pMatch->tArrive.Fall + p->pSuperLib->tDelayInv.Rise;
                ptReqIn->Fall = MAP_MIN( ptReqIn->Fall, ptReqOut->Rise - p->pSuperLib->tDelayInv.Rise );
                ptReqIn->Rise = MAP_MIN( ptReqIn->Rise, ptReqOut->Fall - p->pSuperLib->tDelayInv.Fall );
            }
        }

        // finalize the worst case computation
        pNode->tRequired[0].Worst = MAP_MIN( pNode->tRequired[0].Fall, pNode->tRequired[0].Rise );
        pNode->tRequired[1].Worst = MAP_MIN( pNode->tRequired[1].Fall, pNode->tRequired[1].Rise );

        // skip the PIs
        if ( !Map_NodeIsAnd(pNode) )
            continue;

        // propagate required times of different phases of the node
        // the ordering of phases does not matter since they are mapped independently
        if ( pNode->pCutBest[0] && pNode->tRequired[0].Worst < MAP_FLOAT_LARGE )
            Map_TimePropagateRequiredPhase( p, pNode, 0 );
        if ( pNode->pCutBest[1] && pNode->tRequired[1].Worst < MAP_FLOAT_LARGE )
            Map_TimePropagateRequiredPhase( p, pNode, 1 );
    }
/*
    // in the end, we verify the required times
    // for this, we compute the arrival times of the outputs of each phase 
    // of the supergates using the fanins' required times as the fanins' arrival times
    // the resulting arrival time of the supergate should be less than the actual required time
    for ( k = p->vMapObjs->nSize - 1; k >= 0; k-- )
    {
        pNode = p->vMapObjs->pArray[k];
        if ( pNode->nRefAct[2] == 0 )
            continue;
        if ( !Map_NodeIsAnd(pNode) )
            continue;
        // verify that the required times are propagated correctly
//        if ( pNode->pCutBest[0] && (pNode->nRefAct[0] > 0 || pNode->pCutBest[1] == NULL) )
        if ( pNode->pCutBest[0] && pNode->tRequired[0].Worst < MAP_FLOAT_LARGE/2 )
        {
            Map_MatchComputeReqTimes( pNode->pCutBest[0], 0, ptReqOutTest );
//            assert( ptReqOutTest->Rise < pNode->tRequired[0].Rise + p->fEpsilon );
//            assert( ptReqOutTest->Fall < pNode->tRequired[0].Fall + p->fEpsilon );
        }
//        if ( pNode->pCutBest[1] && (pNode->nRefAct[1] > 0 || pNode->pCutBest[0] == NULL) )
        if ( pNode->pCutBest[1] && pNode->tRequired[1].Worst < MAP_FLOAT_LARGE/2 )
        {
            Map_MatchComputeReqTimes( pNode->pCutBest[1], 1, ptReqOutTest );
//            assert( ptReqOutTest->Rise < pNode->tRequired[1].Rise + p->fEpsilon );
//            assert( ptReqOutTest->Fall < pNode->tRequired[1].Fall + p->fEpsilon );
        }
    }
*/
}